

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkOptionsCommand.h
# Opt level: O0

cmCommand * __thiscall cmTargetLinkOptionsCommand::Clone(cmTargetLinkOptionsCommand *this)

{
  cmCommand *this_00;
  cmTargetLinkOptionsCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x58);
  cmTargetLinkOptionsCommand((cmTargetLinkOptionsCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmTargetLinkOptionsCommand; }